

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

void __thiscall FIX::SessionState::logoutReason(SessionState *this,string *value)

{
  Locker local_20;
  Locker l;
  string *value_local;
  SessionState *this_local;
  
  l.m_mutex = (Mutex *)value;
  Locker::Locker(&local_20,&this->m_mutex);
  std::__cxx11::string::operator=((string *)&this->m_logoutReason,(string *)l.m_mutex);
  Locker::~Locker(&local_20);
  return;
}

Assistant:

void logoutReason(const std::string &value) {
    Locker l(m_mutex);
    m_logoutReason = value;
  }